

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonetree.h
# Opt level: O2

void __thiscall
asmjit::v1_14::ZoneTree<asmjit::v1_14::JitAllocatorBlock>::
insert<asmjit::v1_14::Support::Compare<(asmjit::v1_14::Support::SortOrder)0>>
          (ZoneTree<asmjit::v1_14::JitAllocatorBlock> *this,JitAllocatorBlock *node,
          Compare<(asmjit::v1_14::Support::SortOrder)0> *cmp)

{
  ulong uVar1;
  ZoneTreeNode *pZVar2;
  ulong uVar3;
  ulong uVar4;
  byte *pbVar5;
  JitAllocatorBlock *pJVar6;
  JitAllocatorBlock *pJVar7;
  JitAllocatorBlock *pJVar8;
  JitAllocatorBlock *pJVar9;
  JitAllocatorBlock *root;
  ZoneTreeNode head;
  undefined1 local_40 [16];
  
  if (1 < *(ulong *)node) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/../core/zonetree.h"
               ,0x96,"!node->hasLeft()");
  }
  if (*(long *)&node->field_0x8 == 0) {
    if (*(ulong *)node == 0) {
      pJVar9 = *(JitAllocatorBlock **)this;
      if (pJVar9 == (JitAllocatorBlock *)0x0) {
        *(JitAllocatorBlock **)this = node;
      }
      else {
        pJVar7 = (JitAllocatorBlock *)local_40;
        local_40._0_8_ = 0;
        local_40._8_8_ = pJVar9;
        *(undefined8 *)node = 1;
        uVar1 = 0;
        uVar3 = 0;
        pJVar8 = (JitAllocatorBlock *)0x0;
        root = (JitAllocatorBlock *)0x0;
        while( true ) {
          pJVar6 = pJVar8;
          if (pJVar9 == (JitAllocatorBlock *)0x0) {
            *(ulong *)(&pJVar6->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> + uVar3 * 8) =
                 (ulong)((uint)*(undefined8 *)
                                (&pJVar6->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> +
                                uVar3 * 8) & 1) | (ulong)node;
            pJVar8 = node;
          }
          else {
            pbVar5 = (byte *)(*(ulong *)pJVar9 & 0xfffffffffffffffe);
            pJVar8 = pJVar9;
            if ((((pbVar5 != (byte *)0x0) && ((*pbVar5 & 1) != 0)) &&
                (*(byte **)&pJVar9->field_0x8 != (byte *)0x0)) &&
               ((**(byte **)&pJVar9->field_0x8 & 1) != 0)) {
              *(ulong *)pJVar9 = *(ulong *)pJVar9 | 1;
              *pbVar5 = *pbVar5 & 0xfe;
              **(ulong **)&pJVar9->field_0x8 = **(ulong **)&pJVar9->field_0x8 & 0xfffffffffffffffe;
            }
          }
          if (((pJVar6 != (JitAllocatorBlock *)0x0) &&
              (((undefined1  [104])*pJVar8 & (undefined1  [104])0x1) != (undefined1  [104])0x0)) &&
             (((byte)pJVar6->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> & 1) != 0)) {
            pJVar9 = *(JitAllocatorBlock **)&pJVar7->field_0x8;
            if (pJVar8 == (JitAllocatorBlock *)
                          (*(ulong *)(&pJVar6->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock>
                                     + uVar1 * 8) & 0xfffffffffffffffe)) {
              pZVar2 = _singleRotate((ZoneTreeNode *)root,(ulong)(uVar1 == 0));
            }
            else {
              pZVar2 = _doubleRotate((ZoneTreeNode *)root,(ulong)(uVar1 == 0));
            }
            uVar1 = (ulong)(root == pJVar9);
            *(ulong *)(&pJVar7->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> + uVar1 * 8) =
                 (ulong)((uint)*(undefined8 *)
                                (&pJVar7->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> +
                                uVar1 * 8) & 1) | (ulong)pZVar2;
          }
          if (pJVar8 == node) break;
          uVar4 = (ulong)((pJVar8->_mapping).rx < (node->_mapping).rx);
          if (root != (JitAllocatorBlock *)0x0) {
            pJVar7 = root;
          }
          pJVar9 = (JitAllocatorBlock *)
                   (*(ulong *)(&pJVar8->super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> +
                              uVar4 * 8) & 0xfffffffffffffffe);
          uVar1 = uVar3;
          uVar3 = uVar4;
          root = pJVar6;
        }
        *(undefined8 *)this = local_40._8_8_;
        *(ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> *)local_40._8_8_ =
             (ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock>)
             ((byte)*(ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> *)local_40._8_8_ & 0xfe);
      }
      return;
    }
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/../core/zonetree.h"
               ,0x98,"!node->isRed()");
  }
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/../core/zonetree.h"
             ,0x97,"!node->hasRight()");
}

Assistant:

void insert(NodeT* ASMJIT_NONNULL(node), const CompareT& cmp = CompareT()) noexcept {
    // Node to insert must not contain garbage.
    ASMJIT_ASSERT(!node->hasLeft());
    ASMJIT_ASSERT(!node->hasRight());
    ASMJIT_ASSERT(!node->isRed());

    if (!_root) {
      _root = node;
      return;
    }

    ZoneTreeNode head;           // False root node,
    head._setRight(_root);       // having root on the right.

    ZoneTreeNode* g = nullptr;   // Grandparent.
    ZoneTreeNode* p = nullptr;   // Parent.
    ZoneTreeNode* t = &head;     // Iterator.
    ZoneTreeNode* q = _root;     // Query.

    size_t dir = 0;              // Direction for accessing child nodes.
    size_t last = 0;             // Not needed to initialize, but makes some tools happy.

    node->_makeRed();            // New nodes are always red and violations fixed appropriately.

    // Search down the tree.
    for (;;) {
      if (!q) {
        // Insert new node at the bottom.
        q = node;
        p->_setChild(dir, node);
      }
      else if (_isValidRed(q->_getLeft()) && _isValidRed(q->_getRight())) {
        // Color flip.
        q->_makeRed();
        q->_getLeft()->_makeBlack();
        q->_getRight()->_makeBlack();
      }

      // Fix red violation.
      if (_isValidRed(q) && _isValidRed(p)) {
        ASMJIT_ASSUME(g != nullptr);
        ASMJIT_ASSUME(p != nullptr);
        t->_setChild(t->_getRight() == g,
                     q == p->_getChild(last) ? _singleRotate(g, !last) : _doubleRotate(g, !last));
      }

      // Stop if found.
      if (q == node)
        break;

      last = dir;
      dir = cmp(*static_cast<NodeT*>(q), *static_cast<NodeT*>(node)) < 0;

      // Update helpers.
      if (g) t = g;

      g = p;
      p = q;
      q = q->_getChild(dir);
    }

    // Update root and make it black.
    _root = static_cast<NodeT*>(head._getRight());
    _root->_makeBlack();
  }